

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

char helicsInputGetChar(HelicsInput inp,HelicsError *err)

{
  char cVar1;
  HelicsInput pvVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a9290;
    }
    else {
      pvVar2 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar2 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a9292;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a9290:
  pvVar2 = (HelicsInput)0x0;
LAB_001a9292:
  cVar1 = '\x15';
  if (pvVar2 != (HelicsInput)0x0) {
    cVar1 = helics::Input::getValueChar(*(Input **)((long)pvVar2 + 0x18));
  }
  return cVar1;
}

Assistant:

char helicsInputGetChar(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return '\x15';  // NAK (negative acknowledgment) symbol
    }
    try {
        return inpObj->inputPtr->getValue<char>();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return '\x15';  // NAK (negative acknowledgment) symbol
    }
    // LCOV_EXCL_STOP
}